

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_help.c
# Opt level: O3

void cfg_help_token(autobuf *out,_Bool preamble,cfg_schema_entry *token_entry,
                   cfg_schema_entry *sub_entries,size_t entry_count,
                   cfg_schema_token_customizer *customizer)

{
  char *pcVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  char **ppcVar3;
  size_t sVar4;
  int *piVar5;
  char enum_buffer [20];
  char local_48 [24];
  
  if ((int)CONCAT71(in_register_00000031,preamble) != 0) {
    abuf_appendf(out,"    Parameter is a list of %zu whitespace separater tokens (",entry_count);
    if (entry_count != 0) {
      ppcVar3 = &(sub_entries->key).entry;
      sVar4 = 0;
      do {
        pcVar1 = ", ";
        if (sVar4 == 0) {
          pcVar1 = "";
        }
        abuf_appendf(out,"%s%s",pcVar1,*ppcVar3);
        sVar4 = sVar4 + 1;
        ppcVar3 = ppcVar3 + 0x19;
      } while (entry_count != sVar4);
    }
    abuf_puts(out,
              ").\n    The last token gets the rest of the string, regardless of the number of whitespaces used.\n\n"
             );
  }
  if ((customizer != (cfg_schema_token_customizer *)0x0) &&
     (customizer->cb_valhelp != (_func_void_cfg_schema_entry_ptr_autobuf_ptr *)0x0)) {
    (*customizer->cb_valhelp)(token_entry,out);
  }
  if (entry_count != 0) {
    piVar5 = &_get_enumerator__ENUMERATIONS_rel;
    uVar2 = 0;
    do {
      if (uVar2 < 10) {
        strscpy(local_48,(char *)((long)&_get_enumerator__ENUMERATIONS_rel + (long)*piVar5),0x14);
      }
      else {
        snprintf(local_48,0x14,"%zu.",uVar2 + 1);
      }
      abuf_appendf(out,"    Description of the %s token \'%s\':\n",local_48,(sub_entries->key).entry
                  );
      if (sub_entries->help != (char *)0x0) {
        abuf_appendf(out,"        %s\n");
      }
      if (sub_entries->cb_valhelp != (_func_void_cfg_schema_entry_ptr_autobuf_ptr *)0x0) {
        (*sub_entries->cb_valhelp)(sub_entries,out);
      }
      abuf_puts(out,"\n");
      uVar2 = uVar2 + 1;
      piVar5 = piVar5 + 1;
      sub_entries = sub_entries + 1;
    } while (entry_count != uVar2);
  }
  return;
}

Assistant:

void
cfg_help_token(struct autobuf *out, bool preamble, const struct cfg_schema_entry *token_entry,
  const struct cfg_schema_entry *sub_entries, size_t entry_count,
  const struct cfg_schema_token_customizer *customizer) {
  char enum_buffer[20];
  size_t i;

  if (preamble) {
    abuf_appendf(out,
      CFG_HELP_INDENT_PREFIX "Parameter is a list of"
                             " %" PRINTF_SIZE_T_SPECIFIER " whitespace separater tokens (",
      entry_count);
    for (i = 0; i < entry_count; i++) {
      abuf_appendf(out, "%s%s", i == 0 ? "" : ", ", sub_entries[i].key.entry);
    }
    abuf_puts(out, ").\n" CFG_HELP_INDENT_PREFIX "The last token gets the rest of the string, regardless of"
                   " the number of whitespaces used.\n\n");
  }
  if (customizer && customizer->cb_valhelp) {
    customizer->cb_valhelp(token_entry, out);
  }

  for (i = 0; i < entry_count; i++) {
    abuf_appendf(out, CFG_HELP_INDENT_PREFIX "Description of the %s token '%s':\n",
      _get_enumerator(enum_buffer, sizeof(enum_buffer), i), sub_entries[i].key.entry);

    if (sub_entries[i].help) {
      abuf_appendf(out, CFG_HELP_INDENT_PREFIX CFG_HELP_INDENT_PREFIX "%s\n", sub_entries[i].help);
    }
    if (sub_entries[i].cb_valhelp) {
      sub_entries[i].cb_valhelp(&sub_entries[i], out);
    }
    abuf_puts(out, "\n");
  }
}